

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astDownCastNode_addOntoNodeWithTargetType
          (sysbvm_context_t *context,sysbvm_tuple_t valueExpression,sysbvm_tuple_t targetType)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t typeExpression;
  sysbvm_tuple_t targetTypeExpression;
  sysbvm_tuple_t sourcePosition;
  sysbvm_tuple_t targetType_local;
  sysbvm_tuple_t valueExpression_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_astNode_getSourcePosition(valueExpression);
  typeExpression = sysbvm_astLiteralNode_create(context,sVar1,targetType);
  sVar1 = sysbvm_astDownCastNode_create(context,sVar1,typeExpression,valueExpression);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_astDownCastNode_addOntoNodeWithTargetType(sysbvm_context_t *context, sysbvm_tuple_t valueExpression, sysbvm_tuple_t targetType)
{
    sysbvm_tuple_t sourcePosition = sysbvm_astNode_getSourcePosition(valueExpression);
    sysbvm_tuple_t targetTypeExpression = sysbvm_astLiteralNode_create(context, sourcePosition, targetType);
    return sysbvm_astDownCastNode_create(context, sourcePosition, targetTypeExpression, valueExpression);
}